

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O0

void ipc_cb(void *arg,uint events)

{
  int iVar1;
  ipc_conn *c;
  uint events_local;
  void *arg_local;
  
  if (*(long *)((long)arg + 0xd0) == 0) {
    if ((events & 0x38) == 0) {
      nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
      if ((events & 1) != 0) {
        ipc_doread((ipc_conn *)arg);
      }
      if ((events & 4) != 0) {
        ipc_dowrite((ipc_conn *)arg);
      }
      c._4_4_ = 0;
      iVar1 = nni_list_empty((nni_list *)((long)arg + 0x88));
      if (iVar1 == 0) {
        c._4_4_ = 4;
      }
      iVar1 = nni_list_empty((nni_list *)((long)arg + 0x70));
      if (iVar1 == 0) {
        c._4_4_ = c._4_4_ | 1;
      }
      if (((*(byte *)((long)arg + 0xa0) & 1) == 0) && (c._4_4_ != 0)) {
        nni_posix_pfd_arm((nni_posix_pfd *)((long)arg + 0x38),c._4_4_);
      }
      nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
    }
    else {
      ipc_error(arg,0x1f);
    }
  }
  else {
    nni_posix_ipc_dialer_cb(arg,events);
  }
  return;
}

Assistant:

static void
ipc_cb(void *arg, unsigned events)
{
	ipc_conn *c = arg;

	if (c->dial_aio != NULL) {
		nni_posix_ipc_dialer_cb(arg, events);
		return;
	}
	if ((events & (NNI_POLL_HUP | NNI_POLL_ERR | NNI_POLL_INVAL)) != 0) {
		ipc_error(c, NNG_ECONNSHUT);
		return;
	}
	nni_mtx_lock(&c->mtx);
	if ((events & NNI_POLL_IN) != 0) {
		ipc_doread(c);
	}
	if ((events & NNI_POLL_OUT) != 0) {
		ipc_dowrite(c);
	}
	events = 0;
	if (!nni_list_empty(&c->writeq)) {
		events |= NNI_POLL_OUT;
	}
	if (!nni_list_empty(&c->readq)) {
		events |= NNI_POLL_IN;
	}
	if ((!c->closed) && (events != 0)) {
		nni_posix_pfd_arm(&c->pfd, events);
	}
	nni_mtx_unlock(&c->mtx);
}